

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools.cxx
# Opt level: O0

void __thiscall level_tools::process(level_tools *this,cl_parser *cl)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  xr_ini_file *pxVar4;
  char *pcVar5;
  xr_shaders_xrlc_lib *this_00;
  ulong uVar6;
  xr_file_system *this_01;
  xr_level *this_02;
  char *s;
  char *section;
  xr_file_system *fs;
  string local_78 [32];
  char *local_58;
  char *p;
  char *name;
  size_t num_params;
  size_t i;
  char *local_28;
  char *scene_name;
  char *rmode;
  cl_parser *cl_local;
  level_tools *this_local;
  
  rmode = (char *)cl;
  cl_local = (cl_parser *)this;
  bVar1 = check_paths(this);
  if (!bVar1) {
    return;
  }
  scene_name = (char *)0x0;
  bVar1 = cl_parser::get_string((cl_parser *)rmode,"-mode",&scene_name);
  if (bVar1) {
    iVar2 = strcmp(scene_name,"le");
    if (iVar2 == 0) {
      this->m_rmode = 2;
    }
    else {
      iVar2 = strcmp(scene_name,"le2");
      if (iVar2 == 0) {
        this->m_rmode = 3;
      }
      else {
        iVar2 = strcmp(scene_name,"maya");
        if (iVar2 == 0) {
          this->m_rmode = 1;
        }
        else {
          iVar2 = strcmp(scene_name,"raw");
          if (iVar2 != 0) {
            xray_re::msg("invalid mode");
            return;
          }
          this->m_rmode = 0;
        }
      }
    }
  }
  else {
    this->m_rmode = 1;
  }
  this->m_rflags = 0;
  bVar1 = cl_parser::get_bool((cl_parser *)rmode,"-with_lods");
  if (bVar1) {
    this->m_rflags = this->m_rflags | 1;
  }
  bVar1 = cl_parser::get_bool((cl_parser *)rmode,"-use_mt");
  if (bVar1) {
    this->m_rflags = this->m_rflags | 2;
  }
  bVar1 = cl_parser::get_bool((cl_parser *)rmode,"-dbgcfrm");
  if (bVar1) {
    this->m_rflags = this->m_rflags | 4;
  }
  bVar1 = cl_parser::get_bool((cl_parser *)rmode,"-dbgmrg");
  if (bVar1) {
    this->m_rflags = this->m_rflags | 8;
  }
  bVar1 = cl_parser::get_bool((cl_parser *)rmode,"-terrain");
  if (bVar1) {
    this->m_rflags = this->m_rflags | 0x10;
  }
  local_28 = (char *)0x0;
  bVar1 = cl_parser::get_string((cl_parser *)rmode,"-out",&local_28);
  if (bVar1) {
    sVar3 = cl_parser::num_params((cl_parser *)rmode);
    if (1 < sVar3) {
      xray_re::msg("can\'t set scene name explicitly for multiple input levels");
      return;
    }
    bVar1 = check_scene_name(local_28);
    if (!bVar1) {
      xray_re::msg("invalid scene name");
      return;
    }
  }
  cl_parser::get_string((cl_parser *)rmode,"-sg",&this->m_sg_val);
  pxVar4 = (xr_ini_file *)operator_new(0x18);
  xray_re::xr_ini_file::xr_ini_file(pxVar4,"converter.ini");
  this->m_ini = pxVar4;
  bVar1 = xray_re::xr_ini_file::empty(this->m_ini);
  if ((!bVar1) ||
     (bVar1 = xray_re::xr_ini_file::load(this->m_ini,xray_re::PA_SDK_ROOT,"converter.ini"), bVar1))
  {
    pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,"settings","debug_texture");
    this->m_debug_texture = pcVar5;
    pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,"settings","fake_gamemtl");
    this->m_fake_gamemtl = pcVar5;
    pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,"settings","ladders_gamemtl");
    this->m_ladders_gamemtl = pcVar5;
    pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,"settings","ghost_eshader");
    this->m_ghost_eshader = pcVar5;
    this_00 = (xr_shaders_xrlc_lib *)operator_new(0x20);
    xray_re::xr_shaders_xrlc_lib::xr_shaders_xrlc_lib(this_00);
    this->m_shaders_xrlc_lib = this_00;
    bVar1 = xray_re::xr_shaders_xrlc_lib::load
                      (this->m_shaders_xrlc_lib,"$game_data$","shaders_xrlc.xr");
    if (bVar1) {
      num_params = 0;
      name = (char *)cl_parser::num_params((cl_parser *)rmode);
      for (; (char *)num_params != name; num_params = num_params + 1) {
        p = cl_parser::param((cl_parser *)rmode,num_params);
        local_58 = strchr(p,0x3a);
        pcVar5 = p;
        if (local_58 == (char *)0x0) {
          pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,"profiles","default");
          this->m_sect_profile = pcVar5;
        }
        else {
          pxVar4 = this->m_ini;
          uVar6 = (long)local_58 - (long)p;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_78,pcVar5,uVar6,(allocator *)((long)&fs + 7));
          pcVar5 = (char *)std::__cxx11::string::c_str();
          pcVar5 = xray_re::xr_ini_file::r_string(pxVar4,"profiles",pcVar5);
          this->m_sect_profile = pcVar5;
          std::__cxx11::string::~string(local_78);
          std::allocator<char>::~allocator((allocator<char> *)((long)&fs + 7));
          p = local_58 + 1;
        }
        xray_re::msg("level name: %s",p);
        this_01 = xray_re::xr_file_system::instance();
        bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,this->m_sect_profile,"$game_data$");
        if (bVar1) {
          pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,this->m_sect_profile,"$game_data$");
          xray_re::xr_file_system::update_path(this_01,"$temp_game_data$",pcVar5,"");
        }
        pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,this->m_sect_profile,"$game_levels$");
        xray_re::xr_file_system::update_path(this_01,"$temp_level$",pcVar5,p);
        bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,this->m_sect_profile,"settings");
        if (bVar1) {
          pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,this->m_sect_profile,"settings");
          pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,pcVar5,"ladders_gamemtl");
          if (pcVar5 != (char *)0x0) {
            this->m_ladders_gamemtl = pcVar5;
          }
        }
        this_02 = (xr_level *)operator_new(0xf8);
        xray_re::xr_level::xr_level(this_02);
        this->m_level = this_02;
        bVar1 = xray_re::xr_level::load(this->m_level,"$temp_game_data$","$temp_level$");
        if (bVar1) {
          reconstruct_scene(this,p,local_28);
        }
        else {
          xray_re::msg("can\'t load %s",p);
        }
        if (this->m_level != (xr_level *)0x0) {
          (*this->m_level->_vptr_xr_level[1])();
        }
      }
      this->m_level = (xr_level *)0x0;
    }
    else {
      xray_re::msg("can\'t load %s","shaders_xrlc.xr");
    }
  }
  else {
    xray_re::msg("can\'t load %s","converter.ini");
  }
  return;
}

Assistant:

void level_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

#if 0
	{
		xr_scene* scene = new xr_scene;
		if (!scene->load(cl.parameter(0)))
			throw xr_error();
		if (!scene->save("aaaa"))
			throw xr_error();
		delete scene;
		return;
	}
#endif

	const char* rmode = 0;
	if (!cl.get_string("-mode", rmode)) {
		m_rmode = RM_MAYA;
	} else if (std::strcmp(rmode, "le") == 0) {
		m_rmode = RM_LE;
	} else if (std::strcmp(rmode, "le2") == 0) {
		m_rmode = RM_LE2;
	} else if (std::strcmp(rmode, "maya") == 0) {
		m_rmode = RM_MAYA;
	} else if (std::strcmp(rmode, "raw") == 0) {
		m_rmode = RM_RAW;
	} else {
		msg("invalid mode");
		return;
	}

	m_rflags = 0;
	if (cl.get_bool("-with_lods"))
		m_rflags |= RF_WITH_LODS;
	if (cl.get_bool("-use_mt"))
		m_rflags |= RF_USE_MT;
	if (cl.get_bool("-dbgcfrm"))
		m_rflags |= RF_DEBUG_CFORM;
	if (cl.get_bool("-dbgmrg"))
		m_rflags |= RF_DEBUG_MERGE;
	if (cl.get_bool("-terrain"))
		m_rflags |= RF_TERRAIN;

	const char* scene_name = 0;
	if (cl.get_string("-out", scene_name)) {
		if (cl.num_params() > 1) {
			msg("can't set scene name explicitly for multiple input levels");
			return;
		}
		if (!check_scene_name(scene_name)) {
			msg("invalid scene name");
			return;
		}
	}

	cl.get_string("-sg", m_sg_val);

	m_ini = new xr_ini_file(CONVERTER_INI);
	if (m_ini->empty() && !m_ini->load(PA_SDK_ROOT, CONVERTER_INI)) {
		msg("can't load %s", CONVERTER_INI);
		return;
	}
	// cache profile-independent settings
	m_debug_texture = m_ini->r_string("settings", "debug_texture");
	m_fake_gamemtl = m_ini->r_string("settings", "fake_gamemtl");
	m_ladders_gamemtl = m_ini->r_string("settings", "ladders_gamemtl");
	m_ghost_eshader = m_ini->r_string("settings", "ghost_eshader");

	m_shaders_xrlc_lib = new xr_shaders_xrlc_lib;
	if (!m_shaders_xrlc_lib->load(PA_GAME_DATA, "shaders_xrlc.xr")) {
		msg("can't load %s", "shaders_xrlc.xr");
		return;
	}

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* name = cl.param(i);
		if (const char* p = std::strchr(name, ':')) {
			m_sect_profile = m_ini->r_string("profiles", std::string(name, p - name).c_str());
			name = p + 1;
		} else {
			m_sect_profile = m_ini->r_string("profiles", "default");
		}
		msg("level name: %s", name);
		xr_file_system& fs = xr_file_system::instance();
		if (m_ini->line_exist(m_sect_profile, PA_GAME_DATA))
			fs.update_path("$temp_game_data$", m_ini->r_string(m_sect_profile, PA_GAME_DATA), "");
		fs.update_path("$temp_level$", m_ini->r_string(m_sect_profile, PA_GAME_LEVELS), name);
		
		//load system ini from build for create spawn entity correctly
		//load_system_ini("$temp_game_data$");

		//substitute settings from profile
		if (m_ini->line_exist(m_sect_profile, "settings")) {
			const char* section = m_ini->r_string(m_sect_profile, "settings");
			const char* s = m_ini->r_string(section, "ladders_gamemtl");
			if (s)
				m_ladders_gamemtl = s;
		}

		m_level = new xr_level;
		if (m_level->load("$temp_game_data$", "$temp_level$"))
			reconstruct_scene(name, scene_name);
		else
			msg("can't load %s", name);
		delete m_level;
	}
	m_level = 0;
}